

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O1

uint64_t band(gkc_summary *s,uint64_t delta)

{
  size_t sVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  
  sVar1 = s->nr_elems;
  auVar3._8_4_ = (int)(sVar1 >> 0x20);
  auVar3._0_8_ = sVar1;
  auVar3._12_4_ = 0x45300000;
  dVar5 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * s->epsilon;
  auVar4._8_4_ = (int)(delta >> 0x20);
  auVar4._0_8_ = delta;
  auVar4._12_4_ = 0x45300000;
  dVar5 = (dVar5 + dVar5 + 1.0) -
          ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)delta) - 4503599627370496.0));
  uVar2 = (ulong)dVar5;
  uVar2 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  if (uVar2 == 1) {
    return 0;
  }
  uVar2 = uVar2 >> 1 | uVar2;
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar2 = uVar2 >> 0x10 | uVar2;
  uVar2 = uVar2 >> 0x20 | uVar2;
  return *(uint64_t *)
          (ullog2_magic_table + ((~(uVar2 >> 1) & uVar2) * 0x22fdd63cc95386d >> 0x3a) * 8);
}

Assistant:

static uint64_t band(struct gkc_summary *s, uint64_t delta)
{
    uint64_t diff;

    diff = 1 + (s->epsilon * s->nr_elems * 2) - delta;

    if (diff == 1) {
        return 0;
    } else {
        return ullog2(diff)/ullog2(2);
    }
}